

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_doc_comment.cc
# Opt level: O3

void google::protobuf::compiler::csharp::WriteMethodDocComment
               (Printer *printer,MethodDescriptor *method)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  SourceLocation location;
  undefined1 local_108 [16];
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  SourceLocation local_98;
  
  paVar1 = &local_98.leading_comments.field_2;
  local_98.leading_comments._M_string_length = 0;
  local_98.leading_comments.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_98.trailing_comments.field_2;
  local_98.trailing_comments._M_string_length = 0;
  local_98.trailing_comments.field_2._M_local_buf[0] = '\0';
  local_98.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.leading_comments._M_dataplus._M_p = (pointer)paVar1;
  local_98.trailing_comments._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = MethodDescriptor::GetSourceLocation(method,&local_98);
  if (bVar3) {
    local_108._0_4_ = local_98.start_line;
    local_108._4_4_ = local_98.end_line;
    local_108._8_4_ = local_98.start_column;
    local_108._12_4_ = local_98.end_column;
    local_f8._M_p = (pointer)&local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_98.leading_comments._M_dataplus._M_p,
               local_98.leading_comments._M_dataplus._M_p +
               local_98.leading_comments._M_string_length);
    local_d8._M_p = (pointer)&local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_98.trailing_comments._M_dataplus._M_p,
               local_98.trailing_comments._M_dataplus._M_p +
               local_98.trailing_comments._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b8,&local_98.leading_detached_comments);
    WriteDocCommentBodyImpl(printer,(SourceLocation *)local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.trailing_comments._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.trailing_comments._M_dataplus._M_p,
                    CONCAT71(local_98.trailing_comments.field_2._M_allocated_capacity._1_7_,
                             local_98.trailing_comments.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.leading_comments._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.leading_comments._M_dataplus._M_p,
                    CONCAT71(local_98.leading_comments.field_2._M_allocated_capacity._1_7_,
                             local_98.leading_comments.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void WriteMethodDocComment(io::Printer* printer, const MethodDescriptor* method) {
    WriteDocCommentBody(printer, method);
}